

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadCodeSection(BinaryReader *this,Offset section_size)

{
  bool bVar1;
  Result RVar2;
  Type local_84;
  Enum local_80;
  Type local_type;
  uint local_78;
  Index num_local_types;
  Index k;
  uint local_6c;
  ulong uStack_68;
  Index num_local_decls;
  uint64_t total_locals;
  Offset local_58;
  Offset end_offset;
  Offset body_start_offset;
  Offset OStack_40;
  uint32_t body_size;
  Offset func_offset;
  uint local_30;
  Index func_index;
  Index i;
  Enum local_24;
  Offset local_20;
  Offset section_size_local;
  BinaryReader *this_local;
  
  local_20 = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x30])(this->delegate_,section_size);
  bVar1 = Succeeded((Result)local_24);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    i = (Index)ReadCount(this,&this->num_function_bodies_,"function body count");
    bVar1 = Failed((Result)i);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else if (this->num_function_signatures_ == this->num_function_bodies_) {
      func_index = (*this->delegate_->_vptr_BinaryReaderDelegate[0x31])();
      bVar1 = Succeeded((Result)func_index);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        for (local_30 = 0; local_30 < this->num_function_bodies_; local_30 = local_30 + 1) {
          func_offset._4_4_ = this->num_func_imports_ + local_30;
          OStack_40 = (this->state_).offset;
          (this->state_).offset = OStack_40;
          body_start_offset._0_4_ =
               ReadU32Leb128(this,(uint32_t *)((long)&body_start_offset + 4),"function body size");
          bVar1 = Failed(body_start_offset._0_4_);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          end_offset = (this->state_).offset;
          local_58 = end_offset + body_start_offset._4_4_;
          total_locals._4_4_ =
               (*this->delegate_->_vptr_BinaryReaderDelegate[0x32])
                         (this->delegate_,(ulong)func_offset._4_4_,(ulong)body_start_offset._4_4_);
          bVar1 = Succeeded(total_locals._4_4_);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            PrintError(this,"BeginFunctionBody callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          uStack_68 = 0;
          k = (Index)ReadCount(this,&local_6c,"local declaration count");
          bVar1 = Failed((Result)k);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          num_local_types =
               (*this->delegate_->_vptr_BinaryReaderDelegate[0x33])(this->delegate_,(ulong)local_6c)
          ;
          bVar1 = Succeeded((Result)num_local_types);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            PrintError(this,"OnLocalDeclCount callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          for (local_78 = 0; local_78 < local_6c; local_78 = local_78 + 1) {
            local_80 = (Enum)ReadIndex(this,(Index *)&local_type,"local type count");
            bVar1 = Failed((Result)local_80);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            if (local_type == Any) {
              PrintError(this,"local count must be > 0");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            uStack_68 = (uint)local_type + uStack_68;
            if (0xfffffffe < uStack_68) {
              PrintError(this,"local count must be < 0x10000000");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            RVar2 = ReadType(this,&local_84,"local type");
            bVar1 = Failed(RVar2);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            bVar1 = IsConcreteType(this,local_84);
            if (!bVar1) {
              PrintError(this,"expected valid local type");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x34])
                                    (this->delegate_,(ulong)local_78,(ulong)(uint)local_type,
                                     (ulong)(uint)local_84);
            bVar1 = Succeeded(RVar2);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              PrintError(this,"OnLocalDecl callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
          }
          RVar2 = ReadFunctionBody(this,local_58);
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x76])();
          bVar1 = Succeeded(RVar2);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            PrintError(this,"EndFunctionBody callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x77])();
        bVar1 = Succeeded(RVar2);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
        else {
          PrintError(this,"EndCodeSection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"OnFunctionBodyCount callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
    else {
      PrintError(this,"function signature count != function body count");
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  else {
    PrintError(this,"BeginCodeSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadCodeSection(Offset section_size) {
  CALLBACK(BeginCodeSection, section_size);
  CHECK_RESULT(ReadCount(&num_function_bodies_, "function body count"));
  ERROR_UNLESS(num_function_signatures_ == num_function_bodies_,
               "function signature count != function body count");
  CALLBACK(OnFunctionBodyCount, num_function_bodies_);
  for (Index i = 0; i < num_function_bodies_; ++i) {
    Index func_index = num_func_imports_ + i;
    Offset func_offset = state_.offset;
    state_.offset = func_offset;
    uint32_t body_size;
    CHECK_RESULT(ReadU32Leb128(&body_size, "function body size"));
    Offset body_start_offset = state_.offset;
    Offset end_offset = body_start_offset + body_size;
    CALLBACK(BeginFunctionBody, func_index, body_size);

    uint64_t total_locals = 0;
    Index num_local_decls;
    CHECK_RESULT(ReadCount(&num_local_decls, "local declaration count"));
    CALLBACK(OnLocalDeclCount, num_local_decls);
    for (Index k = 0; k < num_local_decls; ++k) {
      Index num_local_types;
      CHECK_RESULT(ReadIndex(&num_local_types, "local type count"));
      ERROR_UNLESS(num_local_types > 0, "local count must be > 0");
      total_locals += num_local_types;
      ERROR_UNLESS(total_locals < UINT32_MAX,
                   "local count must be < 0x10000000");
      Type local_type;
      CHECK_RESULT(ReadType(&local_type, "local type"));
      ERROR_UNLESS(IsConcreteType(local_type), "expected valid local type");
      CALLBACK(OnLocalDecl, k, num_local_types, local_type);
    }

    CHECK_RESULT(ReadFunctionBody(end_offset));

    CALLBACK(EndFunctionBody, func_index);
  }
  CALLBACK0(EndCodeSection);
  return Result::Ok;
}